

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ClockVarSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ClockVarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&,slang::ast::ClockingSkew&,slang::ast::ClockingSkew&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,ArgumentDirection *args_2,ClockingSkew *args_3,ClockingSkew *args_4
          )

{
  ArgumentDirection AVar1;
  string_view name;
  TimingControl *pTVar2;
  TimingControl *pTVar3;
  EdgeKind EVar4;
  undefined4 uVar5;
  EdgeKind EVar6;
  undefined4 uVar7;
  ClockVarSymbol *this_00;
  
  this_00 = (ClockVarSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ClockVarSymbol *)this->endPtr < this_00 + 1) {
    this_00 = (ClockVarSymbol *)allocateSlow(this,0x180,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  name._M_len = args->_M_len;
  name._M_str = args->_M_str;
  AVar1 = *args_2;
  EVar4 = args_3->edge;
  uVar5 = *(undefined4 *)&args_3->field_0x4;
  pTVar2 = args_3->delay;
  EVar6 = args_4->edge;
  uVar7 = *(undefined4 *)&args_4->field_0x4;
  pTVar3 = args_4->delay;
  ast::ValueSymbol::ValueSymbol
            ((ValueSymbol *)this_00,ClockVar,name,*args_1,
             (bitmask<slang::ast::DeclaredTypeFlags>)0x0);
  (this_00->super_VariableSymbol).lifetime = Static;
  (this_00->super_VariableSymbol).flags.m_bits = 0;
  this_00->direction = AVar1;
  (this_00->inputSkew).edge = EVar4;
  *(undefined4 *)&(this_00->inputSkew).field_0x4 = uVar5;
  (this_00->inputSkew).delay = pTVar2;
  (this_00->outputSkew).edge = EVar6;
  *(undefined4 *)&(this_00->outputSkew).field_0x4 = uVar7;
  (this_00->outputSkew).delay = pTVar3;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }